

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O2

KString * KDIS::UTILS::IndentString
                    (KString *__return_storage_ptr__,KString *S,KUINT16 Tabs,KCHAR8 Tab)

{
  ulong uVar1;
  char cVar2;
  KStringStream NewS;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&NewS);
  std::operator<<(local_1a8,'\t');
  uVar1 = 0;
  while( true ) {
    uVar1 = uVar1 & 0xffff;
    if (S->_M_string_length <= uVar1) break;
    cVar2 = (S->_M_dataplus)._M_p[uVar1];
    if (S->_M_string_length - 1 != uVar1 && cVar2 == '\n') {
      cVar2 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar2);
    uVar1 = (ulong)((int)uVar1 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&NewS);
  return __return_storage_ptr__;
}

Assistant:

static inline KString IndentString( const KString & S, KUINT16 Tabs = 1, KCHAR8 Tab = '\t' )
{
    KStringStream NewS;

    // Add tab to first item and then check all new lines
    AddTabsToStringStream( NewS, Tabs, Tab );

    for( KUINT16 i = 0; i < S.size(); ++i )
    {
        if( S.c_str()[i] == '\n' && i != ( S.size() - 1 ) )
        {
            NewS << S.c_str()[i];
            AddTabsToStringStream( NewS, Tabs, Tab );
        }
        else
        {
            NewS << S.c_str()[i];
        }
    }

    return NewS.str();
}